

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

TopLevelScriptLoadFunctionBodyResolveInfo * __thiscall
TTD::UnorderedArrayList<TTD::NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo,_512UL>::
NextOpenEntry(UnorderedArrayList<TTD::NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo,_512UL>
              *this)

{
  TopLevelScriptLoadFunctionBodyResolveInfo *pTVar1;
  TopLevelScriptLoadFunctionBodyResolveInfo *entry;
  UnorderedArrayList<TTD::NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo,_512UL>
  *this_local;
  
  if ((this->m_inlineHeadBlock).EndPos < (this->m_inlineHeadBlock).CurrPos) {
    TTDAbort_unrecoverable_error("We are off the end of the array");
  }
  if (0x200 < (ulong)((long)(this->m_inlineHeadBlock).CurrPos -
                     (long)(this->m_inlineHeadBlock).BlockData) / 0x78) {
    TTDAbort_unrecoverable_error("We are off the end of the array");
  }
  if ((this->m_inlineHeadBlock).CurrPos == (this->m_inlineHeadBlock).EndPos) {
    AddArrayLink(this);
  }
  pTVar1 = (this->m_inlineHeadBlock).CurrPos;
  (this->m_inlineHeadBlock).CurrPos = (this->m_inlineHeadBlock).CurrPos + 1;
  return pTVar1;
}

Assistant:

T* NextOpenEntry()
        {
            TTDAssert(this->m_inlineHeadBlock.CurrPos <= this->m_inlineHeadBlock.EndPos, "We are off the end of the array");
            TTDAssert((((byte*)this->m_inlineHeadBlock.CurrPos) - ((byte*)this->m_inlineHeadBlock.BlockData)) / sizeof(T) <= allocSize, "We are off the end of the array");

            if (this->m_inlineHeadBlock.CurrPos == this->m_inlineHeadBlock.EndPos)
            {
                this->AddArrayLink();
            }

            T* entry = this->m_inlineHeadBlock.CurrPos;
            this->m_inlineHeadBlock.CurrPos++;

            return entry;
        }